

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int PatchWeapon(int weapNum)

{
  byte *pbVar1;
  PClassAmmo *pPVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  uint statenum;
  size_t sVar8;
  ulong uVar9;
  FState *state;
  FDecalTemplate *pFVar10;
  char *pcVar11;
  PClassActor *cls;
  AActor *defaults;
  FStateDefinitions statedef;
  BYTE dummy [1416];
  FStateDefinitions local_5f8;
  AActor local_5b8;
  
  uVar3 = (ulong)(uint)weapNum;
  local_5f8.StateArray.Array = (FState *)0x0;
  local_5f8.StateArray.Most = 0;
  local_5f8.StateArray.Count = 0;
  local_5f8.StateLabels.Array = (FStateDefine *)0x0;
  local_5f8.StateLabels.Most = 0;
  local_5f8.StateLabels.Count = 0;
  local_5f8.laststate = (FState *)0x0;
  local_5f8.laststatebeforelabel = (FState *)0x0;
  local_5f8.lastlabel = -1;
  if ((((uint)weapNum < 9) && ((uint)weapNum < WeaponNames.Count)) &&
     (cls = WeaponNames.Array[uVar3], cls != (PClassActor *)0x0)) {
    defaults = (AActor *)(cls->super_PClass).Defaults;
    bVar4 = false;
    DPrintf(4,"Weapon %d\n",uVar3);
  }
  else {
    cls = (PClassActor *)0x0;
    Printf("Weapon %d out of range.\n",uVar3);
    defaults = &local_5b8;
    bVar4 = true;
  }
  iVar7 = GetLine();
  if (iVar7 == 1) {
    bVar5 = false;
    do {
      pcVar11 = Line2;
      statenum = atoi(Line2);
      pcVar6 = Line1;
      sVar8 = strlen(Line1);
      if (sVar8 < 9) {
        iVar7 = strcasecmp(pcVar6,"Decal");
        if (iVar7 == 0) {
          stripwhite(pcVar11);
          pFVar10 = FDecalLib::GetDecalByName(&DecalLibrary,pcVar11);
          if (pFVar10 == (FDecalTemplate *)0x0) {
            Printf("Weapon %d: Unknown decal %s\n",uVar3,Line2);
          }
          else {
            defaults->DecalGenerator = &pFVar10->super_FDecalBase;
          }
        }
        else {
          iVar7 = strcasecmp(pcVar6,"Ammo use");
          if ((iVar7 == 0) || (iVar7 = strcasecmp(pcVar6,"Ammo per shot"), iVar7 == 0)) {
            *(uint *)&defaults[1].OldRenderPos.X = statenum;
            pbVar1 = (byte *)((long)&(defaults->flags6).Value + 3);
            *pbVar1 = *pbVar1 | 0x10;
          }
          else {
            iVar7 = strcasecmp(pcVar6,"Min ammo");
            if (iVar7 != 0) goto LAB_004b4892;
            *(uint *)&defaults[1].__Pos.Z = statenum;
          }
        }
      }
      else {
        iVar7 = strcasecmp(pcVar6 + (sVar8 - 6)," frame");
        if (iVar7 == 0) {
          state = FindState(statenum);
          if ((!bVar4) && (!bVar5)) {
            bVar5 = true;
            FStateDefinitions::MakeStateDefines(&local_5f8,cls);
          }
          pcVar6 = Line1;
          iVar7 = strncasecmp(Line1,"Deselect",8);
          pcVar11 = "Select";
          if (iVar7 != 0) {
            iVar7 = strncasecmp(pcVar6,"Select",6);
            pcVar11 = "Deselect";
            if (iVar7 != 0) {
              iVar7 = strncasecmp(pcVar6,"Bobbing",7);
              pcVar11 = "Ready";
              if (iVar7 != 0) {
                iVar7 = strncasecmp(pcVar6,"Shooting",8);
                pcVar11 = "Fire";
                if (iVar7 != 0) {
                  iVar7 = strncasecmp(pcVar6,"Firing",6);
                  pcVar11 = "Flash";
                  if (iVar7 != 0) goto LAB_004b49ea;
                }
              }
            }
          }
          FStateDefinitions::SetStateLabel(&local_5f8,pcVar11,state,'\x01');
        }
        else {
          iVar7 = strcasecmp(pcVar6,"Ammo type");
          if (iVar7 == 0) {
            uVar9 = (ulong)statenum;
            if (AmmoNames.Count <= statenum) {
              uVar9 = 5;
            }
            if (0xb < statenum) {
              uVar9 = 5;
            }
            pPVar2 = AmmoNames.Array[uVar9];
            defaults[1].sprev = (AActor **)pPVar2;
            if ((pPVar2 != (PClassAmmo *)0x0) &&
               (*(int *)&defaults[1].__Pos.Y =
                     *(int *)((pPVar2->super_PClassInventory).super_PClassActor.super_PClass.
                              Defaults + 0x4a8) * 2, *(int *)&defaults[1].OldRenderPos.X == 0)) {
              *(undefined4 *)&defaults[1].OldRenderPos.X = 1;
            }
          }
          else {
LAB_004b4892:
            Printf("Unknown key %s encountered in %s %d.\n",pcVar6,"Weapon",uVar3);
          }
        }
      }
LAB_004b49ea:
      iVar7 = GetLine();
    } while (iVar7 == 1);
  }
  else {
    bVar5 = false;
  }
  if (defaults[1].sprev == (AActor **)0x0) {
    *(undefined4 *)&defaults[1].OldRenderPos.X = 0;
  }
  if (bVar5) {
    FStateDefinitions::InstallStates(&local_5f8,cls,defaults);
  }
  TArray<FState,_FState>::~TArray(&local_5f8.StateArray);
  TArray<FStateDefine,_FStateDefine>::~TArray(&local_5f8.StateLabels);
  return iVar7;
}

Assistant:

static int PatchWeapon (int weapNum)
{
	int result;
	PClassActor *type = NULL;
	BYTE dummy[sizeof(AWeapon)];
	AWeapon *info = (AWeapon *)&dummy;
	bool patchedStates = false;
	FStateDefinitions statedef;

	if (weapNum >= 0 && weapNum < 9 && (unsigned)weapNum < WeaponNames.Size())
	{
		type = WeaponNames[weapNum];
		if (type != NULL)
		{
			info = (AWeapon *)GetDefaultByType (type);
			DPrintf (DMSG_SPAMMY, "Weapon %d\n", weapNum);
		}
	}

	if (type == NULL)
	{
		Printf ("Weapon %d out of range.\n", weapNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);

		if (strlen (Line1) >= 9)
		{
			if (stricmp (Line1 + strlen (Line1) - 6, " frame") == 0)
			{
				FState *state = FindState (val);

				if (type != NULL && !patchedStates)
				{
					statedef.MakeStateDefines(type);
					patchedStates = true;
				}

				if (strnicmp (Line1, "Deselect", 8) == 0)
					statedef.SetStateLabel("Select", state);
				else if (strnicmp (Line1, "Select", 6) == 0)
					statedef.SetStateLabel("Deselect", state);
				else if (strnicmp (Line1, "Bobbing", 7) == 0)
					statedef.SetStateLabel("Ready", state);
				else if (strnicmp (Line1, "Shooting", 8) == 0)
					statedef.SetStateLabel("Fire", state);
				else if (strnicmp (Line1, "Firing", 6) == 0)
					statedef.SetStateLabel("Flash", state);
			}
			else if (stricmp (Line1, "Ammo type") == 0)
			{
				if (val < 0 || val >= 12 || (unsigned)val >= AmmoNames.Size())
				{
					val = 5;
				}
				info->AmmoType1 = AmmoNames[val];
				if (info->AmmoType1 != NULL)
				{
					info->AmmoGive1 = ((AAmmo*)GetDefaultByType (info->AmmoType1))->Amount * 2;
					if (info->AmmoUse1 == 0)
					{
						info->AmmoUse1 = 1;
					}
				}
			}
			else
			{
				Printf (unknown_str, Line1, "Weapon", weapNum);
			}
		}
		else if (stricmp (Line1, "Decal") == 0)
		{
			stripwhite (Line2);
			const FDecalTemplate *decal = DecalLibrary.GetDecalByName (Line2);
			if (decal != NULL)
			{
				info->DecalGenerator = const_cast <FDecalTemplate *>(decal);
			}
			else
			{
				Printf ("Weapon %d: Unknown decal %s\n", weapNum, Line2);
			}
		}
		else if (stricmp (Line1, "Ammo use") == 0 || stricmp (Line1, "Ammo per shot") == 0)
		{
			info->AmmoUse1 = val;
			info->flags6 |= MF6_INTRYMOVE;	// flag the weapon for postprocessing (reuse a flag that can't be set by external means)
		}
		else if (stricmp (Line1, "Min ammo") == 0)
		{
			info->MinAmmo1 = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Weapon", weapNum);
		}
	}

	if (info->AmmoType1 == NULL)
	{
		info->AmmoUse1 = 0;
	}

	if (patchedStates)
	{
		statedef.InstallStates(type, info);
	}

	return result;
}